

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O3

bool __thiscall
cmCMakePolicyCommand::HandleGetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  long lVar4;
  ostream *poVar5;
  PolicyID id;
  char *value;
  bool parent_scope;
  cmMakefile *pcVar6;
  pointer pbVar7;
  PolicyID pid;
  ostringstream e;
  PolicyID local_1c4;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
  if (lVar4 == 0x80) {
    iVar2 = std::__cxx11::string::compare((char *)(pbVar7 + 3));
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (iVar2 != 0) {
      lVar4 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
      goto LAB_002928e4;
    }
    parent_scope = true;
  }
  else {
LAB_002928e4:
    if (lVar4 != 0x60) {
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"GET must be given exactly 2 additional arguments.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a0);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      return false;
    }
    parent_scope = false;
  }
  bVar1 = cmPolicies::GetPolicyID(pbVar7[1]._M_dataplus._M_p,&local_1c4);
  if (bVar1) {
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,local_1c4,parent_scope);
    if (REQUIRED_ALWAYS < PVar3) {
      return bVar1;
    }
    switch(PVar3) {
    case OLD:
      pcVar6 = (this->super_cmCommand).Makefile;
      value = "OLD";
      break;
    case WARN:
      pcVar6 = (this->super_cmCommand).Makefile;
      value = "";
      break;
    case NEW:
      pcVar6 = (this->super_cmCommand).Makefile;
      value = "NEW";
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c0,(cmPolicies *)(ulong)local_1c4,id);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"The call to cmake_policy(GET ",0x1d);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,pbVar7[1]._M_dataplus._M_p,pbVar7[1]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...) at which this ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"error appears requests the policy, and this version of CMake ",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"requires that the policy be set to NEW before it is checked.",0x3c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) goto LAB_00292b06;
      goto LAB_00292b13;
    }
    cmMakefile::AddDefinition(pcVar6,pbVar7 + 2,value);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"GET given policy \"",0x12);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,pbVar7[1]._M_dataplus._M_p,pbVar7[1]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" which is not known to this ",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"version of CMake.",0x11);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_00292b06:
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
LAB_00292b13:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return bVar1;
}

Assistant:

bool cmCMakePolicyCommand::HandleGetMode(std::vector<std::string> const& args)
{
  bool parent_scope = false;
  if (args.size() == 4 && args[3] == "PARENT_SCOPE") {
    // Undocumented PARENT_SCOPE option for use within CMake.
    parent_scope = true;
  } else if (args.size() != 3) {
    this->SetError("GET must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET given policy \"" << id << "\" which is not known to this "
      << "version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy setting.
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(pid, parent_scope);
  switch (status) {
    case cmPolicies::OLD:
      // Report that the policy is set to OLD.
      this->Makefile->AddDefinition(var, "OLD");
      break;
    case cmPolicies::WARN:
      // Report that the policy is not set.
      this->Makefile->AddDefinition(var, "");
      break;
    case cmPolicies::NEW:
      // Report that the policy is set to NEW.
      this->Makefile->AddDefinition(var, "NEW");
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // The policy is required to be set before anything needs it.
      {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(pid) << "\n"
          << "The call to cmake_policy(GET " << id << " ...) at which this "
          << "error appears requests the policy, and this version of CMake "
          << "requires that the policy be set to NEW before it is checked.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
  }

  return true;
}